

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SleepImpl.cpp
# Opt level: O0

void sf::priv::sleepImpl(Time time)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  undefined1 local_28 [8];
  timespec ti;
  Uint64 usecs;
  Time time_local;
  
  usecs = time.m_microseconds;
  ti.tv_nsec = Time::asMicroseconds((Time *)&usecs);
  ti.tv_sec = ((ulong)ti.tv_nsec % 1000000) * 1000;
  local_28 = (undefined1  [8])((ulong)ti.tv_nsec / 1000000);
  do {
    iVar1 = nanosleep((timespec *)local_28,(timespec *)local_28);
    bVar3 = false;
    if (iVar1 == -1) {
      piVar2 = __errno_location();
      bVar3 = *piVar2 == 4;
    }
  } while (bVar3);
  return;
}

Assistant:

void sleepImpl(Time time)
{
    Uint64 usecs = time.asMicroseconds();

    // Construct the time to wait
    timespec ti;
    ti.tv_nsec = (usecs % 1000000) * 1000;
    ti.tv_sec = usecs / 1000000;

    // Wait...
    // If nanosleep returns -1, we check errno. If it is EINTR
    // nanosleep was interrupted and has set ti to the remaining
    // duration. We continue sleeping until the complete duration
    // has passed. We stop sleeping if it was due to an error.
    while ((nanosleep(&ti, &ti) == -1) && (errno == EINTR))
    {
    }
}